

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QAbstractAnimation::~QAbstractAnimation(QAbstractAnimation *this)

{
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *this_00;
  long lVar1;
  QAnimationGroup *this_01;
  parameter_type pVar2;
  parameter_type _t1;
  
  *(undefined ***)this = &PTR_metaObject_00667be8;
  lVar1 = *(long *)(this + 8);
  this_00 = (QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
             *)(lVar1 + 0x78);
  pVar2 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
          ::value(this_00);
  if (pVar2 != Stopped) {
    pVar2 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
            ::value(this_00);
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::setValue(this_00,Stopped);
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::notify(this_00);
    _t1 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
          ::value(this_00);
    stateChanged(this,_t1,pVar2);
    if (pVar2 == Running) {
      QAnimationTimer::unregisterAnimation((QAbstractAnimation *)this);
    }
  }
  this_01 = *(QAnimationGroup **)(lVar1 + 0x98);
  if (this_01 != (QAnimationGroup *)0x0) {
    QAnimationGroup::removeAnimation(this_01,(QAbstractAnimation *)this);
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QAbstractAnimation::~QAbstractAnimation()
{
    Q_D(QAbstractAnimation);
    //we can't call stop here. Otherwise we get pure virtual calls
    if (d->state != Stopped) {
        QAbstractAnimation::State oldState = d->state;
        d->state = Stopped;
        d->state.notify();
        emit stateChanged(d->state, oldState);
        if (oldState == QAbstractAnimation::Running)
            QAnimationTimer::unregisterAnimation(this);
    }
    if (d->group)
        d->group->removeAnimation(this);
}